

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFrameworkMultiConfigPostfix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  cmGlobalGenerator *pcVar4;
  string *psVar5;
  string local_68;
  undefined1 local_48 [8];
  string configProp;
  cmValue postfix;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  cmValue::cmValue((cmValue *)((long)&configProp.field_2 + 8),(nullptr_t)0x0);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    cmsys::SystemTools::UpperCase(&local_68,config);
    cmStrCat<char_const(&)[32],std::__cxx11::string>
              ((string *)local_48,(char (*) [32])"FRAMEWORK_MULTI_CONFIG_POSTFIX_",&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    configProp.field_2._8_8_ = GetProperty(this,(string *)local_48);
    bVar1 = IsImported(this);
    if (((!bVar1) &&
        (bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&configProp.field_2 + 8)), bVar1))
       && (bVar1 = IsFrameworkOnApple(this), bVar1)) {
      pcVar4 = GetGlobalGenerator(this);
      uVar2 = (*pcVar4->_vptr_cmGlobalGenerator[0x28])();
      if ((uVar2 & 1) == 0) {
        cmValue::operator=((cmValue *)((long)&configProp.field_2 + 8),(nullptr_t)0x0);
      }
    }
    std::__cxx11::string::~string((string *)local_48);
  }
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&configProp.field_2 + 8));
  if (bVar1) {
    psVar5 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&configProp.field_2 + 8));
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar5);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFrameworkMultiConfigPostfix(
  const std::string& config) const
{
  cmValue postfix = nullptr;
  if (!config.empty()) {
    std::string configProp = cmStrCat("FRAMEWORK_MULTI_CONFIG_POSTFIX_",
                                      cmSystemTools::UpperCase(config));
    postfix = this->GetProperty(configProp);

    if (!this->IsImported() && postfix &&
        (this->IsFrameworkOnApple() &&
         !this->GetGlobalGenerator()->IsMultiConfig())) {
      postfix = nullptr;
    }
  }
  return postfix ? *postfix : std::string();
}